

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableIntTest_SerializingToString_Test<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  key_type kVar4;
  key_type kVar5;
  key_type kVar6;
  value_type vVar7;
  key_type kVar8;
  Type type;
  AssertHelper *this_00;
  char *message;
  AssertionResult *this_01;
  long in_RDI;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar__1;
  TypeParam ht_in;
  AssertionResult gtest_ar_;
  StringIO stringio;
  string stringbuf;
  int i;
  TypeParam ht_out;
  undefined4 in_stack_fffffffffffffb18;
  int in_stack_fffffffffffffb1c;
  HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb20;
  undefined4 in_stack_fffffffffffffb28;
  undefined4 in_stack_fffffffffffffb2c;
  char *in_stack_fffffffffffffb30;
  undefined4 in_stack_fffffffffffffb38;
  int in_stack_fffffffffffffb3c;
  allocator_type *in_stack_fffffffffffffb40;
  undefined4 in_stack_fffffffffffffb48;
  Type in_stack_fffffffffffffb4c;
  hasher *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb5c;
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffb60;
  undefined4 in_stack_fffffffffffffb80;
  undefined2 in_stack_fffffffffffffb84;
  undefined1 in_stack_fffffffffffffb86;
  string *s;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb98;
  value_type in_stack_fffffffffffffb9c;
  uint i_00;
  string local_430 [48];
  key_type local_400;
  undefined1 local_3f9;
  AssertionResult local_3f8;
  string local_3e8 [48];
  key_type local_3b8;
  undefined1 local_3b1;
  AssertionResult local_3b0 [2];
  key_type local_38c;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_388;
  Type local_364;
  AssertionResult local_360;
  string local_350 [48];
  key_type local_320;
  undefined1 local_319;
  AssertionResult local_318 [2];
  key_type local_2f4;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2f0;
  value_type local_2cc;
  AssertionResult local_2c8 [2];
  key_type local_2a4;
  dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_2a0;
  value_type local_27c;
  AssertionResult local_278;
  string local_268 [55];
  undefined1 local_231;
  AssertionResult local_230;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_220 [2];
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_1f8;
  string local_170 [55];
  undefined1 local_139;
  AssertionResult local_138;
  StringIO local_128;
  string local_120;
  key_type local_100;
  key_type local_fc;
  value_type local_d0;
  int local_cc;
  key_type local_c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b8 [2];
  BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_90;
  
  bVar1 = google::
          HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
          ::supports_serialization
                    ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                      *)(in_RDI + 0x10));
  if (bVar1) {
    i_00 = 0;
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_b8,i_00,(int *)(ulong)i_00);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffb60,
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               in_stack_fffffffffffffb50,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_b8);
    kVar4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_c8 = kVar4;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::set_deleted_key((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb20,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    for (local_cc = 1; local_cc < 100; local_cc = local_cc + 1) {
      in_stack_fffffffffffffb9c =
           HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
      local_d0 = in_stack_fffffffffffffb9c;
      google::
      BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
      ::insert((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                *)CONCAT44(i_00,kVar4),
               (value_type *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98));
    }
    kVar5 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_fc = kVar5;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb20,
            (key_type *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    kVar6 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_100 = kVar6;
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::erase((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             *)in_stack_fffffffffffffb20,
            (key_type *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    s = &local_120;
    std::__cxx11::string::string((string *)s);
    StringIO::StringIO(&local_128,s);
    uVar2 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::serialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_90,&local_128);
    local_139 = uVar2;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,
               (bool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (type *)0xf89695);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_138);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb90),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffb86,
                                                 CONCAT24(in_stack_fffffffffffffb84,
                                                          in_stack_fffffffffffffb80))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_170);
      testing::Message::~Message((Message *)0xf89771);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf89808);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    TransparentHasher::TransparentHasher
              ((TransparentHasher *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_220,0,(int *)0x0);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)in_stack_fffffffffffffb60,
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               in_stack_fffffffffffffb50,
               (key_equal *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
               in_stack_fffffffffffffb40);
    Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_220);
    uVar3 = google::
            BaseHashtableInterface<google::dense_hashtable<int,int,TransparentHasher,Negation<int>,SetKey<int,Negation<int>>,TransparentHasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
            ::unserialize<google::sparsehash_internal::pod_serializer<int>,StringIO>
                      (&local_1f8,&local_128);
    local_231 = uVar3;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,
               (bool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (type *)0xf898b6);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_230);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb90),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb84,
                                                                in_stack_fffffffffffffb80))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_268);
      testing::Message::~Message((Message *)0xf899ca);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf89a61);
    vVar7 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_27c = vVar7;
    local_2a4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb60,
           (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_2a0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30,
               (int *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (int *)in_stack_fffffffffffffb20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_278);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      testing::AssertionResult::failure_message((AssertionResult *)0xf89b41);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xf89b9e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf89c0f);
    local_2cc = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_2f4 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb60,
           (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_2f0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30,
               (int *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (int *)in_stack_fffffffffffffb20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_2c8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb60 =
           (BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)testing::AssertionResult::failure_message((AssertionResult *)0xf89cef);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
                 (char *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xf89d4c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf89dbd);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_320 = kVar8;
    this_00 = (AssertHelper *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb20,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_319 = this_00 == (AssertHelper *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,
               (bool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (type *)0xf89e25);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_318);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb90),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb84,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,in_stack_fffffffffffffb4c,(char *)in_stack_fffffffffffffb40,
                 in_stack_fffffffffffffb3c,in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_350);
      testing::Message::~Message((Message *)0xf89efa);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf89f91);
    type = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           ::UniqueObject(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_364 = type;
    local_38c = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    google::
    BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::find(in_stack_fffffffffffffb60,(key_type *)CONCAT44(kVar8,in_stack_fffffffffffffb58));
    google::
    dense_hashtable_iterator<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::operator*(&local_388);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_fffffffffffffb3c,in_stack_fffffffffffffb38),
               in_stack_fffffffffffffb30,
               (int *)CONCAT44(in_stack_fffffffffffffb2c,in_stack_fffffffffffffb28),
               (int *)in_stack_fffffffffffffb20);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      in_stack_fffffffffffffb40 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0xf8a071);
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb3c,
                 in_stack_fffffffffffffb30);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      testing::Message::~Message((Message *)0xf8a0ce);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8a13f);
    kVar8 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    local_3b8 = kVar8;
    message = (char *)google::
                      BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                               *)in_stack_fffffffffffffb20,
                              (key_type *)
                              CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_3b1 = message == (char *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffb20,
               (bool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (type *)0xf8a1a7);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3b0);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb90),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb84,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb40,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_3e8);
      testing::Message::~Message((Message *)0xf8a27c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8a313);
    local_400 = HashtableTest<google::HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueKey(in_stack_fffffffffffffb20,in_stack_fffffffffffffb1c);
    this_01 = (AssertionResult *)
              google::
              BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::count((BaseHashtableInterface<google::dense_hashtable<int,_int,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)in_stack_fffffffffffffb20,
                      (key_type *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18));
    local_3f9 = this_01 == (AssertionResult *)0x0;
    testing::AssertionResult::AssertionResult<bool>
              (this_01,(bool *)CONCAT44(in_stack_fffffffffffffb1c,in_stack_fffffffffffffb18),
               (type *)0xf8a37b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
    if (!bVar1) {
      testing::Message::Message((Message *)this_00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((AssertionResult *)CONCAT44(in_stack_fffffffffffffb9c,kVar5),
                 (char *)CONCAT44(kVar6,in_stack_fffffffffffffb90),(char *)s,
                 (char *)CONCAT17(uVar2,CONCAT16(uVar3,CONCAT24(in_stack_fffffffffffffb84,vVar7))));
      std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (this_00,type,(char *)in_stack_fffffffffffffb40,kVar8,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(i_00,kVar4),
                 (Message *)CONCAT44(in_stack_fffffffffffffb9c,kVar5));
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)this_01);
      std::__cxx11::string::~string(local_430);
      testing::Message::~Message((Message *)0xf8a450);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xf8a4e4);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf8a4f1);
    std::__cxx11::string::~string((string *)&local_120);
    google::
    HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
    ::~HashtableInterface_DenseHashtable
              ((HashtableInterface_DenseHashtable<int,_int,_kEmptyInt,_TransparentHasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                *)0xf8a50b);
  }
  return;
}

Assistant:

TYPED_TEST(HashtableIntTest, SerializingToString) {
  if (!this->ht_.supports_serialization()) return;
  TypeParam ht_out;
  ht_out.set_deleted_key(this->UniqueKey(2000));
  for (int i = 1; i < 100; i++) {
    ht_out.insert(this->UniqueObject(i));
  }
  // just to test having some erased keys when we write.
  ht_out.erase(this->UniqueKey(56));
  ht_out.erase(this->UniqueKey(22));

  string stringbuf;
  StringIO stringio(&stringbuf);
  EXPECT_TRUE(
      ht_out.serialize(typename TypeParam::NopointerSerializer(), &stringio));

  TypeParam ht_in;
  EXPECT_TRUE(
      ht_in.unserialize(typename TypeParam::NopointerSerializer(), &stringio));

  EXPECT_EQ(this->UniqueObject(1), *ht_in.find(this->UniqueKey(1)));
  EXPECT_EQ(this->UniqueObject(99), *ht_in.find(this->UniqueKey(99)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(100)));
  EXPECT_EQ(this->UniqueObject(21), *ht_in.find(this->UniqueKey(21)));
  // should not have been saved
  EXPECT_FALSE(ht_in.count(this->UniqueKey(22)));
  EXPECT_FALSE(ht_in.count(this->UniqueKey(56)));
}